

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall
Analyser_algebraicSystemWithThreeLinkedUnknownsWithOneExternalVariable_Test::
~Analyser_algebraicSystemWithThreeLinkedUnknownsWithOneExternalVariable_Test
          (Analyser_algebraicSystemWithThreeLinkedUnknownsWithOneExternalVariable_Test *this)

{
  Analyser_algebraicSystemWithThreeLinkedUnknownsWithOneExternalVariable_Test *this_local;
  
  ~Analyser_algebraicSystemWithThreeLinkedUnknownsWithOneExternalVariable_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Analyser, algebraicSystemWithThreeLinkedUnknownsWithOneExternalVariable)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/algebraic_system_with_three_linked_unknowns/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "Variable 'z' in component 'my_algebraic_system' is computed more than once.",
        "Variable 'y' in component 'my_algebraic_system' is computed more than once.",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("my_algebraic_system")->variable("x")));

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES_CELLMLELEMENTTYPES_LEVELS_REFERENCERULES_URLS(expectedIssues,
                                                                   expectedCellmlElementTypes(expectedIssues.size(), libcellml::CellmlElementType::VARIABLE),
                                                                   expectedLevels(expectedIssues.size(), libcellml::Issue::Level::ERROR),
                                                                   expectedReferenceRules(expectedIssues.size(), libcellml::Issue::ReferenceRule::ANALYSER_VARIABLE_COMPUTED_MORE_THAN_ONCE),
                                                                   expectedUrls(expectedIssues.size(), "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_VARIABLE_COMPUTED_MORE_THAN_ONCE"),
                                                                   analyser);

    EXPECT_EQ(libcellml::AnalyserModel::Type::OVERCONSTRAINED, analyser->model()->type());
}